

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzarc3d.cpp
# Opt level: O2

void __thiscall pzgeom::TPZArc3D::ComputeAtributes(TPZArc3D *this,TPZFMatrix<double> *coord)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double *pdVar13;
  int i_1;
  int i;
  long lVar14;
  long col;
  TPZFNMatrix<9,_double> *this_00;
  double local_378;
  double local_318;
  double Yb;
  double Xb;
  double Ya;
  double Xa;
  TPZVec<double> Temp;
  TPZFNMatrix<9,_double> IBaseCnCP;
  TPZFNMatrix<9,_double> axest;
  TPZFNMatrix<9,_double> NotUsedHere;
  
  NotUsedHere.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)0x0;
  TPZFNMatrix<9,_double>::TPZFNMatrix(&IBaseCnCP,3,3,(double *)&NotUsedHere);
  axest.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)0x0;
  TPZFNMatrix<9,_double>::TPZFNMatrix(&NotUsedHere,3,3,(double *)&axest);
  this_00 = &this->fIBaseCn;
  TPZFMatrix<double>::Resize(&this_00->super_TPZFMatrix<double>,3,3);
  TPZFMatrix<double>::Resize(&(this->fICnBase).super_TPZFMatrix<double>,3,3);
  TPZManVector<double,_3>::Resize(&this->fCenter3D,3);
  for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
    pdVar13 = TPZFMatrix<double>::operator()(coord,lVar14,0);
    dVar1 = *pdVar13;
    pdVar13 = TPZFMatrix<double>::operator()(coord,lVar14,2);
    dVar2 = *pdVar13;
    pdVar13 = TPZFMatrix<double>::operator()(&IBaseCnCP.super_TPZFMatrix<double>,lVar14,0);
    *pdVar13 = dVar1 - dVar2;
    pdVar13 = TPZFMatrix<double>::operator()(coord,lVar14,1);
    dVar1 = *pdVar13;
    pdVar13 = TPZFMatrix<double>::operator()(coord,lVar14,2);
    dVar2 = *pdVar13;
    pdVar13 = TPZFMatrix<double>::operator()(&IBaseCnCP.super_TPZFMatrix<double>,lVar14,1);
    *pdVar13 = dVar1 - dVar2;
  }
  pdVar13 = TPZFMatrix<double>::operator()(coord,1,1);
  dVar1 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(coord,2,0);
  dVar2 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(coord,1,2);
  dVar3 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(coord,2,0);
  dVar4 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(coord,1,0);
  dVar5 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(coord,2,1);
  dVar6 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(coord,1,2);
  dVar7 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(coord,2,1);
  dVar8 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(coord,1,0);
  dVar9 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(coord,2,2);
  dVar10 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(coord,1,1);
  dVar11 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(coord,2,2);
  dVar12 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(&IBaseCnCP.super_TPZFMatrix<double>,0,2);
  *pdVar13 = dVar11 * dVar12 +
             (((dVar5 * dVar6 + -dVar1 * dVar2 + dVar3 * dVar4) - dVar7 * dVar8) - dVar9 * dVar10);
  pdVar13 = TPZFMatrix<double>::operator()(coord,0,1);
  dVar1 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(coord,2,0);
  dVar2 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(coord,0,2);
  dVar3 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(coord,2,0);
  dVar4 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(coord,0,0);
  dVar5 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(coord,2,1);
  dVar6 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(coord,0,2);
  dVar7 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(coord,2,1);
  dVar8 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(coord,0,0);
  dVar9 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(coord,2,2);
  dVar10 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(coord,0,1);
  dVar11 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(coord,2,2);
  dVar12 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(&IBaseCnCP.super_TPZFMatrix<double>,1,2);
  *pdVar13 = (dVar9 * dVar10 + dVar7 * dVar8 + ((dVar1 * dVar2 - dVar3 * dVar4) - dVar5 * dVar6)) -
             dVar11 * dVar12;
  pdVar13 = TPZFMatrix<double>::operator()(coord,0,1);
  dVar1 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(coord,1,0);
  dVar2 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(coord,0,2);
  dVar3 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(coord,1,0);
  dVar4 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(coord,0,0);
  dVar5 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(coord,1,1);
  dVar6 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(coord,0,2);
  dVar7 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(coord,1,1);
  dVar8 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(coord,0,0);
  dVar9 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(coord,1,2);
  dVar10 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(coord,0,1);
  dVar11 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(coord,1,2);
  dVar12 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(&IBaseCnCP.super_TPZFMatrix<double>,2,2);
  *pdVar13 = dVar11 * dVar12 +
             (((dVar5 * dVar6 + -dVar1 * dVar2 + dVar3 * dVar4) - dVar7 * dVar8) - dVar9 * dVar10);
  TPZFNMatrix<9,_double>::TPZFNMatrix
            (&axest,IBaseCnCP.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                    fRow,
             IBaseCnCP.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol);
  TPZFMatrix<double>::GramSchmidt
            (&IBaseCnCP.super_TPZFMatrix<double>,&axest.super_TPZFMatrix<double>,
             &NotUsedHere.super_TPZFMatrix<double>);
  TPZFMatrix<double>::operator=(&this_00->super_TPZFMatrix<double>,&axest.super_TPZFMatrix<double>);
  TPZFMatrix<double>::Transpose
            (&axest.super_TPZFMatrix<double>,(TPZMatrix<double> *)&this->fICnBase);
  ComputeR2Points(this,coord,&Xa,&Ya,&Xb,&Yb);
  this->fXcenter = Xa * 0.5;
  this->fYcenter = (Yb * Yb + (Xb * Xb - Xa * Xb)) / (Yb + Yb);
  local_318 = 0.0;
  TPZVec<double>::TPZVec(&Temp,3,&local_318);
  *Temp.fStore = this->fXcenter;
  Temp.fStore[1] = this->fYcenter;
  Temp.fStore[2] = 0.0;
  for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
    local_378 = 0.0;
    for (col = 0; col != 3; col = col + 1) {
      pdVar13 = TPZFMatrix<double>::operator()(&this_00->super_TPZFMatrix<double>,lVar14,col);
      local_378 = local_378 + *pdVar13 * Temp.fStore[col];
    }
    pdVar13 = TPZFMatrix<double>::operator()(coord,lVar14,2);
    (this->fCenter3D).super_TPZVec<double>.fStore[lVar14] = local_378 + *pdVar13;
  }
  this->fRadius = SQRT(this->fXcenter * this->fXcenter + this->fYcenter * this->fYcenter);
  local_318 = 0.0;
  TPZManVector<double,_3>::Resize(&this->finitialVector,2,&local_318);
  pdVar13 = (this->finitialVector).super_TPZVec<double>.fStore;
  *pdVar13 = Xa - this->fXcenter;
  pdVar13[1] = Ya - this->fYcenter;
  TPZVec<double>::~TPZVec(&Temp);
  TPZFNMatrix<9,_double>::~TPZFNMatrix(&axest);
  TPZFNMatrix<9,_double>::~TPZFNMatrix(&NotUsedHere);
  TPZFNMatrix<9,_double>::~TPZFNMatrix(&IBaseCnCP);
  return;
}

Assistant:

void TPZArc3D::ComputeAtributes(TPZFMatrix<REAL> &coord)
{
#ifdef PZDEBUG
	/** Cross[(mid-ini),(fin-ini)] */
	double CrossX, CrossY, CrossZ;
	try
	{
		CrossX = fabs(-(coord(1,1)*coord(2,0)) + coord(1,2)*coord(2,0) + coord(1,0)*coord(2,1) - coord(1,2)*coord(2,1) - coord(1,0)*coord(2,2) + coord(1,1)*coord(2,2));
		CrossY = fabs(coord(0,1)*coord(2,0) - coord(0,2)*coord(2,0) - coord(0,0)*coord(2,1) + coord(0,2)*coord(2,1) + coord(0,0)*coord(2,2) - coord(0,1)*coord(2,2));
		CrossZ = fabs(-(coord(0,1)*coord(1,0)) + coord(0,2)*coord(1,0) + coord(0,0)*coord(1,1) - coord(0,2)*coord(1,1) - coord(0,0)*coord(1,2) + coord(0,1)*coord(1,2));	
	}
	catch(...){
		std::cout << "Arc3D element with nodes coordinates non initialized!!!\n";
		DebugStop();
	}
	
	/** If Cross[(mid-ini),(fin-ini)] == 0, than the 3 given points are co-linear */
	if(CrossX <= 1.E-6 && CrossY <= 1.E-6 && CrossZ <= 1.E-6)
	{
		cout << "The 3 given points that define an TPZArc3D are co-linear!\n";
		cout << "Method aborted!";
		
		DebugStop();
	}
#endif
	
	/** fIBaseCn -> Basis Change Matrix: from Base(R2) to Canonic(R3) | fIBaseCn 1st column = BaseX | fIBaseCn 2nd column = BaseY */
	TPZFNMatrix<9> IBaseCnCP(3,3,0.), NotUsedHere(3,3,0.);
	fIBaseCn.Resize(3,3); fICnBase.Resize(3,3); fCenter3D.Resize(3);
	for(int i = 0; i < 3; i++)
	{
		IBaseCnCP(i,0) = coord(i,0) - coord(i,2);
		IBaseCnCP(i,1) = coord(i,1) - coord(i,2);
	}
	
	/** fIBaseCn 3rd column = BaseZ = Cross[BaseX,BaseY] |  */
	IBaseCnCP(0,2) = -coord(1,1)*coord(2,0) + coord(1,2)*coord(2,0) + coord(1,0)*coord(2,1) - coord(1,2)*coord(2,1) - coord(1,0)*coord(2,2) + coord(1,1)*coord(2,2);
	IBaseCnCP(1,2) =  coord(0,1)*coord(2,0) - coord(0,2)*coord(2,0) - coord(0,0)*coord(2,1) + coord(0,2)*coord(2,1) + coord(0,0)*coord(2,2) - coord(0,1)*coord(2,2);
	IBaseCnCP(2,2) = -coord(0,1)*coord(1,0) + coord(0,2)*coord(1,0) + coord(0,0)*coord(1,1) - coord(0,2)*coord(1,1) - coord(0,0)*coord(1,2) + coord(0,1)*coord(1,2);
	
	TPZFNMatrix<9> axest(IBaseCnCP.Rows(),IBaseCnCP.Cols());
	IBaseCnCP.GramSchmidt(axest,NotUsedHere);
	
	fIBaseCn = axest;
	axest.Transpose(&fICnBase);
	
	/** fICnBase -> Basis Change Matrix: from Canonic(R3) to Base(R2) | fICnBase(i,0) = Inverse[fIBaseCn] */
	//	fIBaseCn = fICnBase; fIBaseCn.Transpose();
	
	double Xa, Ya, Xb, Yb;
	ComputeR2Points(coord,Xa,Ya,Xb,Yb);
	
	/** Computing the Center Coordinates in R2 base */
	fXcenter = Xa/2.;
	fYcenter = (-Xa*Xb + Xb*Xb + Yb*Yb) / (2.*Yb);
	
	/** Computing the Center Coordinates in R3 base */
	TPZVec<REAL> Temp(3,0.);
	Temp[0] = fXcenter; Temp[1] = fYcenter; Temp[2] = 0.; double temp = 0.;
	for(int i = 0; i < 3; i++)
	{
		for(int j = 0; j < 3; j++) temp += fIBaseCn(i,j)*Temp[j];
		fCenter3D[i] = temp + coord(i,2);
		temp = 0.;
	}
	
	/** Computing Radius */
	fRadius = sqrt( fXcenter*fXcenter + fYcenter*fYcenter );
	
	/** Computing (Center->First_Point) vector */
	finitialVector.Resize(2,0.);
	finitialVector[0] = Xa - fXcenter; finitialVector[1] = Ya - fYcenter;
    
    
    
#ifdef PZDEBUG2
    
    TPZFNMatrix<9,REAL> nodes=coord;
    TPZManVector<REAL,1> loc(1,0.0);
    TPZManVector<REAL,3> result(3.);
    
    REAL resultlocminus1, resultloc0,resultlocplus1;
    
    loc[0] = -1.;
    X(nodes,loc,result);
    for (int i=0; i<3; i++) {
        result[i] -= nodes(i,0);
    }
    resultlocminus1 = Norm(result);
    
    //cout << result << endl;
    
    loc[0] = 1.;
    X(nodes,loc,result);
    for (int i=0; i<3; i++) {
        result[i] -= nodes(i,1);
    }
    resultlocplus1 = Norm(result);
    
    //cout << result << endl;
    loc[0] = 0.;
    X(nodes,loc,result);
    for (int i=0; i<3; i++) {
        result[i] -= nodes(i,2);
    }
    resultloc0 = Norm(result);
    //cout << result << endl;

    
    // testes
    /** If result* !=0 , o ponto mapeados e diferente da coordenada recebida  */
    if(resultlocminus1 >= 1.E-6 ) // loc = -1 ponto da esquerda do arco
    {
        cout << "Method aborted!";
        
        DebugStop();
    }
    if(resultlocplus1 >= 1.E-6) // loc = 1 ponto da direita do arco
    {
        cout << "Method aborted!";
        
        DebugStop();
    }
    if(resultloc0 >= 1.E-6) // loc = 0 ponto do centro do arco
    {

        cout << "Method aborted!";
        
        DebugStop();
    }
#endif
    
}